

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O3

REF_STATUS ref_fixture_tri_surf_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  undefined8 uVar7;
  ulong uVar8;
  int iVar9;
  REF_INT RVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  char *pcVar15;
  REF_INT cell;
  REF_INT local [27];
  REF_INT local_9c;
  int local_98;
  int local_94;
  int local_90 [28];
  
  uVar4 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar4 != 0) {
    uVar8 = (ulong)uVar4;
    pcVar15 = "create";
    uVar7 = 0x2f;
    goto LAB_00111bb9;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node = pRVar1->node;
  pRVar1->surf = 1;
  iVar5 = ref_mpi->n;
  iVar6 = ref_mpi->id;
  iVar9 = 0;
  iVar13 = (int)(2 / (long)iVar5);
  iVar12 = iVar13 * iVar5;
  if (2 < iVar12) {
    iVar9 = ((((iVar5 + 2) / iVar5) * (iVar12 + -3)) / iVar13 - iVar12) + 3;
  }
  if (iVar6 == iVar9) {
LAB_00111684:
    uVar4 = ref_node_add(ref_node,0,&local_98);
    if (uVar4 != 0) {
      uVar8 = (ulong)uVar4;
      pcVar15 = "add node";
      uVar7 = 0x3f;
      goto LAB_00111bb9;
    }
    pRVar2 = ref_node->real;
    lVar14 = (long)local_98;
    pRVar3 = pRVar2 + lVar14 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar14 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar14) && (local_98 < ref_node->max)) && (-1 < ref_node->global[lVar14])) {
      lVar11 = ref_node->global[lVar14];
    }
    iVar5 = ref_mpi->n;
    iVar6 = (iVar5 + 2) / iVar5;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(2 % (long)iVar5) + 1)) {
      lVar11 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar11 = ref_node->global[lVar14];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar11 = ref_node->global[lVar14];
        }
      }
      iVar13 = (int)(2 / (long)iVar5);
      iVar5 = 3 - iVar5 * iVar13;
      RVar10 = iVar5 + (int)((lVar11 - iVar6 * iVar5) / (long)iVar13);
    }
    ref_node->part[lVar14] = RVar10;
    uVar4 = ref_node_add(ref_node,1,&local_94);
    if (uVar4 != 0) {
      uVar8 = (ulong)uVar4;
      pcVar15 = "add node";
      uVar7 = 0x40;
      goto LAB_00111bb9;
    }
    pRVar3 = ref_node->real;
    lVar14 = (long)local_94;
    pRVar3[lVar14 * 0xf] = 1.0;
    pRVar3 = pRVar3 + lVar14 * 0xf + 1;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar14) && (local_94 < ref_node->max)) && (-1 < ref_node->global[lVar14])) {
      lVar11 = ref_node->global[lVar14];
    }
    iVar5 = ref_mpi->n;
    iVar6 = (iVar5 + 2) / iVar5;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(2 % (long)iVar5) + 1)) {
      lVar11 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar11 = ref_node->global[lVar14];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar11 = ref_node->global[lVar14];
        }
      }
      iVar13 = (int)(2 / (long)iVar5);
      iVar5 = 3 - iVar5 * iVar13;
      RVar10 = iVar5 + (int)((lVar11 - iVar6 * iVar5) / (long)iVar13);
    }
    ref_node->part[lVar14] = RVar10;
    uVar4 = ref_node_add(ref_node,2,local_90);
    if (uVar4 != 0) {
      uVar8 = (ulong)uVar4;
      pcVar15 = "add node";
      uVar7 = 0x41;
      goto LAB_00111bb9;
    }
    pRVar2 = ref_node->real;
    lVar14 = (long)local_90[0];
    pRVar3 = pRVar2 + lVar14 * 0xf;
    *(undefined4 *)pRVar3 = 0;
    *(undefined4 *)((long)pRVar3 + 4) = 0;
    *(undefined4 *)(pRVar3 + 1) = 0;
    *(undefined4 *)((long)pRVar3 + 0xc) = 0x3ff00000;
    pRVar2[lVar14 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar14) && (local_90[0] < ref_node->max)) && (-1 < ref_node->global[lVar14])) {
      lVar11 = ref_node->global[lVar14];
    }
    iVar5 = ref_mpi->n;
    iVar6 = (iVar5 + 2) / iVar5;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(2 % (long)iVar5) + 1)) {
      lVar11 = -1;
      if ((-1 < local_90[0]) && (local_90[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar11 = ref_node->global[lVar14];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_90[0]) && (local_90[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar11 = ref_node->global[lVar14];
        }
      }
      iVar13 = (int)(2 / (long)iVar5);
      iVar5 = 3 - iVar5 * iVar13;
      RVar10 = iVar5 + (int)((lVar11 - iVar6 * iVar5) / (long)iVar13);
    }
    ref_node->part[lVar14] = RVar10;
    local_90[1] = 10;
    uVar4 = ref_cell_add(pRVar1->cell[3],&local_98,&local_9c);
    if (uVar4 != 0) {
      uVar8 = (ulong)uVar4;
      pcVar15 = "add tri";
      uVar7 = 0x43;
      goto LAB_00111bb9;
    }
  }
  else {
    iVar5 = (iVar5 + 2) / iVar5;
    iVar9 = 0;
    if (iVar5 + 1U < 3) {
      iVar9 = iVar5;
    }
    iVar12 = 3 - iVar12;
    if (iVar12 <= iVar9) {
      iVar9 = (1 - iVar5 * iVar12) / iVar13 + iVar12;
    }
    if (iVar6 == iVar9) goto LAB_00111684;
    iVar9 = (int)(2 / (long)iVar5);
    if (iVar12 <= iVar9) {
      iVar9 = (2 - iVar5 * iVar12) / iVar13 + iVar12;
    }
    if (iVar6 == iVar9) goto LAB_00111684;
  }
  uVar4 = ref_node_initialize_n_global(ref_node,3);
  if (uVar4 == 0) {
    iVar5 = ref_mpi->n;
    iVar6 = (iVar5 + 2) / iVar5;
    iVar13 = 0;
    if (iVar6 + 1U < 3) {
      iVar13 = iVar6;
    }
    iVar9 = (int)(2 / (long)iVar5);
    iVar5 = 3 - iVar9 * iVar5;
    if (iVar5 <= iVar13) {
      iVar13 = (1 - iVar5 * iVar6) / iVar9 + iVar5;
    }
    if (ref_mpi->id != iVar13) {
      iVar13 = (int)(2 / (long)iVar6);
      if (iVar5 <= iVar13) {
        iVar13 = (2 - iVar6 * iVar5) / iVar9 + iVar5;
      }
      if (ref_mpi->id != iVar13) {
        return 0;
      }
    }
    uVar4 = ref_node_local(ref_node,1,&local_98);
    if (uVar4 == 0) {
      uVar4 = ref_node_local(ref_node,2,&local_94);
      if (uVar4 == 0) {
        local_90[1] = 0x14;
        uVar4 = ref_cell_add(pRVar1->cell[0],&local_98,&local_9c);
        if (uVar4 == 0) {
          return 0;
        }
        uVar8 = (ulong)uVar4;
        pcVar15 = "add edg";
        uVar7 = 0x52;
      }
      else {
        uVar8 = (ulong)uVar4;
        pcVar15 = "loc";
        uVar7 = 0x50;
      }
    }
    else {
      uVar8 = (ulong)uVar4;
      pcVar15 = "loc";
      uVar7 = 0x4f;
    }
  }
  else {
    uVar8 = (ulong)uVar4;
    pcVar15 = "init glob";
    uVar7 = 0x46;
  }
LAB_00111bb9:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar7,
         "ref_fixture_tri_surf_grid",uVar8,pcVar15);
  return (REF_STATUS)uVar8;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_tri_surf_grid(REF_GRID *ref_grid_ptr,
                                             REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT nnodesg = 3;
  REF_INT cell;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  ref_grid_surf(ref_grid) = REF_TRUE;

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 10;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 1.0, 0.0, 0.0);
    add_that_node(2, 0.0, 1.0, 0.0);
    local[3] = global[3];
    RSS(ref_cell_add(ref_grid_tri(ref_grid), local, &cell), "add tri");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  global[0] = 1;
  global[1] = 2;
  global[3] = 20;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    local[3] = global[3];
    RSS(ref_cell_add(ref_grid_edg(ref_grid), local, &cell), "add edg");
  }

  return REF_SUCCESS;
}